

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerErrors_Test::
~Sampler_testProbabilisticSamplerErrors_Test(Sampler_testProbabilisticSamplerErrors_Test *this)

{
  Sampler_testProbabilisticSamplerErrors_Test *this_local;
  
  ~Sampler_testProbabilisticSamplerErrors_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerErrors)
{
    ProbabilisticSampler sampler(-0.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
    sampler = ProbabilisticSampler(1.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
}